

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall cs::statement_catch::~statement_catch(statement_catch *this)

{
  statement_catch *in_RDI;
  
  ~statement_catch(in_RDI);
  statement_base::operator_delete((void *)0x1c8872);
  return;
}

Assistant:

statement_catch() = delete;